

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdflib.c
# Opt level: O3

int by_encoding(void *a,void *b)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(long *)((long)b + 8) <= *(long *)((long)a + 8)) {
    uVar1 = (uint)(*(long *)((long)b + 8) < *(long *)((long)a + 8));
  }
  return uVar1;
}

Assistant:

static int
  by_encoding( const void*  a,
               const void*  b )
  {
    bdf_glyph_t  *c1, *c2;


    c1 = (bdf_glyph_t *)a;
    c2 = (bdf_glyph_t *)b;

    if ( c1->encoding < c2->encoding )
      return -1;

    if ( c1->encoding > c2->encoding )
      return 1;

    return 0;
  }